

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

bool __thiscall
cmDepends::Check(cmDepends *this,char *makeFile,char *internalFile,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                *validDeps)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool collapse;
  allocator local_279;
  string oldcwd;
  string local_258;
  ifstream fin;
  byte abStack_218 [488];
  
  std::__cxx11::string::string((string *)&oldcwd,".",(allocator *)&fin);
  bVar1 = std::operator!=(&this->CompileDirectory,".");
  if (bVar1) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&fin,(SystemTools *)0x0,collapse);
    std::__cxx11::string::operator=((string *)&oldcwd,(string *)&fin);
    std::__cxx11::string::~string((string *)&fin);
    cmsys::SystemTools::ChangeDirectory(&this->CompileDirectory);
  }
  std::ifstream::ifstream(&fin,internalFile,_S_in);
  if ((abStack_218[*(long *)(_fin + -0x18)] & 5) == 0) {
    iVar3 = (*this->_vptr_cmDepends[3])(this,&fin,internalFile,validDeps);
    bVar1 = true;
    if ((char)iVar3 != '\0') goto LAB_003a5029;
  }
  Clear(this,makeFile);
  std::__cxx11::string::string((string *)&local_258,internalFile,&local_279);
  cmsys::SystemTools::RemoveFile(&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  bVar1 = false;
LAB_003a5029:
  bVar2 = std::operator!=(&oldcwd,".");
  if (bVar2) {
    cmsys::SystemTools::ChangeDirectory(&oldcwd);
  }
  std::ifstream::~ifstream(&fin);
  std::__cxx11::string::~string((string *)&oldcwd);
  return bVar1;
}

Assistant:

bool cmDepends::Check(const char *makeFile, const char *internalFile,
                      std::map<std::string, DependencyVector>& validDeps)
{
  // Dependency checks must be done in proper working directory.
  std::string oldcwd = ".";
  if(this->CompileDirectory != ".")
    {
    // Get the CWD but do not call CollapseFullPath because
    // we only need it to cd back, and the form does not matter
    oldcwd = cmSystemTools::GetCurrentWorkingDirectory(false);
    cmSystemTools::ChangeDirectory(this->CompileDirectory);
    }

  // Check whether dependencies must be regenerated.
  bool okay = true;
  cmsys::ifstream fin(internalFile);
  if(!(fin && this->CheckDependencies(fin, internalFile, validDeps)))
    {
    // Clear all dependencies so they will be regenerated.
    this->Clear(makeFile);
    cmSystemTools::RemoveFile(internalFile);
    okay = false;
    }

  // Restore working directory.
  if(oldcwd != ".")
    {
    cmSystemTools::ChangeDirectory(oldcwd);
    }

  return okay;
}